

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O0

void __thiscall
GdlBinaryExpression::GdlBinaryExpression(GdlBinaryExpression *this,GdlBinaryExpression *exp)

{
  undefined8 uVar1;
  long in_RSI;
  undefined8 *in_RDI;
  GdlExpression *in_stack_ffffffffffffffb8;
  undefined8 *puVar2;
  GdlExpression *in_stack_ffffffffffffffc0;
  
  GdlExpression::GdlExpression(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR_Clone_0036b2e0;
  in_RDI[7] = *(undefined8 *)(in_RSI + 0x38);
  uVar1 = (**(code **)**(undefined8 **)(in_RSI + 0x40))();
  in_RDI[8] = uVar1;
  puVar2 = in_RDI + 9;
  uVar1 = (**(code **)**(undefined8 **)(in_RSI + 0x48))();
  *puVar2 = uVar1;
  return;
}

Assistant:

GdlBinaryExpression(const GdlBinaryExpression & exp)
		:	GdlExpression(exp),
			m_psymOperator(exp.m_psymOperator),
			m_pexpOperand1(exp.m_pexpOperand1->Clone()),
			m_pexpOperand2(exp.m_pexpOperand2->Clone())
	{
	}